

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedstack.cpp
# Opt level: O0

ElementType Pop(LinkedStack *LS)

{
  ElementType EVar1;
  ostream *this;
  ElementType tmpData;
  LinkedStack *LS_local;
  
  if (LS->stack->size == 0) {
    this = std::operator<<((ostream *)&std::cout,"Pop: underflowed!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  EVar1 = GetData(LS->stack);
  DeleteAt(LS->stack);
  return EVar1;
}

Assistant:

ElementType Pop(LinkedStack *LS) {  //出栈
    ElementType tmpData;
    if(!(LS->stack)->size) { //若栈为空
        cout << "Pop: underflowed!" << endl;
        exit(1);
    }
    tmpData = GetData(LS->stack);
    DeleteAt(LS->stack);
    return tmpData;
}